

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbdl_utils.cc
# Opt level: O2

Scalar RigidBodyDynamics::Utils::CalcPotentialEnergy
                 (Model *model,VectorNd *q,bool update_kinematics)

{
  ResScalar RVar1;
  Scalar mass;
  Vector3d g;
  Vector3d com;
  double local_80;
  void *local_78;
  double dStack_70;
  double local_68;
  ulong local_60 [2];
  undefined8 local_50;
  Vector3d local_48;
  PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *local_30 [2];
  
  local_60[0] = (ulong)model->qdot_size;
  local_50 = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_78,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)local_60);
  CalcCenterOfMass(model,q,(VectorNd *)&local_78,(VectorNd *)0x0,&local_80,&local_48,(Vector3d *)0x0
                   ,(Vector3d *)0x0,(Vector3d *)0x0,(Vector3d *)0x0,update_kinematics);
  free(local_78);
  local_78 = (void *)(model->gravity).super_Vector3d.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                     array[0];
  dStack_70 = (model->gravity).super_Vector3d.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
  ;
  local_68 = (model->gravity).super_Vector3d.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2];
  local_30[0] = (PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_78;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  _set_noalias<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>>
            ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)local_60,
             (DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)local_30);
  RVar1 = Eigen::internal::
          dot_nocheck<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_false>
          ::run((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_48,
                (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_60);
  return RVar1 * local_80;
}

Assistant:

RBDL_DLLAPI Scalar CalcPotentialEnergy (
  Model &model,
  const Math::VectorNd &q,
  bool update_kinematics)
{
  Scalar mass;
  Vector3d com;
  CalcCenterOfMass (
    model,
    q,
    VectorNd::Zero (model.qdot_size),
    NULL,
    mass,
    com,
    NULL,
    NULL,
    NULL,
    NULL,
    update_kinematics);

  Vector3d g = - Vector3d (model.gravity[0], model.gravity[1], model.gravity[2]);
  LOG << "pot_energy: " << " mass = " << mass << " com = " << com.transpose() <<
      std::endl;

  return mass * com.dot(g);
}